

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void QUnifiedTimer::pauseAnimationTimer(QAbstractAnimationTimer *timer,int duration)

{
  bool bVar1;
  QUnifiedTimer *this;
  long in_FS_OFFSET;
  QAbstractAnimationTimer *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this = instance(true);
  if (timer->isRegistered == false) {
    startAnimationTimer(timer);
  }
  bVar1 = timer->isPaused;
  timer->isPaused = true;
  timer->pauseDuration = duration;
  if (bVar1 == false) {
    local_30 = timer;
    QtPrivate::QPodArrayOps<QAbstractAnimationTimer*>::emplace<QAbstractAnimationTimer*&>
              ((QPodArrayOps<QAbstractAnimationTimer*> *)&this->pausedAnimationTimers,
               (this->pausedAnimationTimers).d.size,&local_30);
    QList<QAbstractAnimationTimer_*>::end(&this->pausedAnimationTimers);
  }
  localRestart((QUnifiedTimer *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnifiedTimer::pauseAnimationTimer(QAbstractAnimationTimer *timer, int duration)
{
    QUnifiedTimer *inst = QUnifiedTimer::instance();
    if (!timer->isRegistered)
        inst->startAnimationTimer(timer);

    bool timerWasPaused = timer->isPaused;
    timer->isPaused = true;
    timer->pauseDuration = duration;
    if (!timerWasPaused)
        inst->pausedAnimationTimers << timer;
    inst->localRestart();
}